

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void patchJump(int offset)

{
  ObjFunction *pOVar1;
  int iVar2;
  
  pOVar1 = current->function;
  iVar2 = (pOVar1->chunk).count - offset;
  if (0x10001 < iVar2) {
    error("Too much code to jump over.");
    pOVar1 = current->function;
  }
  iVar2 = iVar2 + -2;
  (pOVar1->chunk).code[offset] = (uint8_t)((uint)iVar2 >> 8);
  (current->function->chunk).code[(long)offset + 1] = (uint8_t)iVar2;
  return;
}

Assistant:

static void patchJump(int offset) {
    // -2 to adjust for the bytecode for the jump offset itself.
    int jump = currentChunk()->count - offset - 2;

    // Set limitation for JUMP instruction
    if (jump > UINT16_MAX) {
        error("Too much code to jump over.");
    }

    currentChunk()->code[offset] = (jump >> 8) & 0xff;
    currentChunk()->code[offset + 1] = jump & 0xff;
}